

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

void __thiscall leveldb::MemTableIterator::~MemTableIterator(MemTableIterator *this)

{
  ~MemTableIterator(this);
  operator_delete(this);
  return;
}

Assistant:

~MemTableIterator() override = default;